

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O2

void __thiscall cmCMakePresetsGraph::Preset::Preset(Preset *this,Preset *param_1)

{
  File *pFVar1;
  undefined7 uVar2;
  
  this->_vptr_Preset = (_func_int **)&PTR__Preset_007a10c0;
  std::__cxx11::string::string((string *)&this->Name,(string *)&param_1->Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Inherits,&param_1->Inherits);
  uVar2 = *(undefined7 *)&param_1->field_0x41;
  pFVar1 = param_1->OriginFile;
  this->Hidden = param_1->Hidden;
  *(undefined7 *)&this->field_0x41 = uVar2;
  this->OriginFile = pFVar1;
  std::__cxx11::string::string((string *)&this->DisplayName,(string *)&param_1->DisplayName);
  std::__cxx11::string::string((string *)&this->Description,(string *)&param_1->Description);
  std::__shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->ConditionEvaluator).
              super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>,
             &(param_1->ConditionEvaluator).
              super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>);
  this->ConditionResult = param_1->ConditionResult;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_Rb_tree(&(this->Environment)._M_t,&(param_1->Environment)._M_t);
  return;
}

Assistant:

Preset(const Preset& /*other*/) = default;